

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall Highs::basisForSolution(Highs *this)

{
  double dVar1;
  int iVar2;
  HighsStatus HVar3;
  reference pvVar4;
  long in_RDI;
  string *in_stack_00000028;
  HighsBasis *in_stack_00000030;
  Highs *in_stack_00000038;
  HighsInt num_basic_row;
  HighsInt iRow;
  HighsInt num_basic_col;
  HighsInt iCol;
  HighsBasis basis;
  HighsInt num_basic;
  HighsLp *lp;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  HighsBasis *in_stack_ffffffffffffff10;
  value_type vVar5;
  allocator local_c1;
  string local_c0 [32];
  int local_a0;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  int local_98;
  uint local_94;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_7d;
  int local_7c;
  uint local_14;
  int *local_10;
  
  local_10 = (int *)(in_RDI + 0x138);
  invalidateBasis((Highs *)0x4d78b2);
  local_14 = 0;
  HighsBasis::HighsBasis(in_stack_ffffffffffffff10);
  for (local_7c = 0; local_7c < *local_10; local_7c = local_7c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 8),(long)local_7c);
    dVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)local_7c);
    if (*(double *)(in_RDI + 0xbc0) < ABS(dVar1 - *pvVar4)) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),(long)local_7c
                         );
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)local_7c)
      ;
      if (*(double *)(in_RDI + 0xbc0) < ABS(dVar1 - *pvVar4)) {
        local_14 = local_14 + 1;
        local_8e = 1;
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::push_back
                  ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
      else {
        local_8d = 2;
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::push_back
                  ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
    }
    else {
      local_7d = 0;
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::push_back
                ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
  }
  local_94 = local_14;
  for (local_98 = 0; local_98 < local_10[1]; local_98 = local_98 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),(long)local_98)
    ;
    dVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(long)local_98);
    if (*(double *)(in_RDI + 0xbc0) < ABS(dVar1 - *pvVar4)) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                          (long)local_98);
      vVar5 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(long)local_98)
      ;
      if (*(double *)(in_RDI + 0xbc0) < ABS(vVar5 - *pvVar4)) {
        local_14 = local_14 + 1;
        local_9b = 1;
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::push_back
                  ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
      else {
        local_9a = 2;
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::push_back
                  ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
    }
    else {
      local_99 = 0;
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::push_back
                ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
  }
  iVar2 = local_14 - local_94;
  local_a0 = iVar2;
  highsLogDev((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
              "LP has %d rows and solution yields %d possible basic variables (%d / %d; %d / %d)\n",
              (ulong)(uint)local_10[1],(ulong)local_14,(ulong)local_94,*local_10,iVar2,local_10[1]);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"",&local_c1);
  HVar3 = setBasis(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  HighsBasis::~HighsBasis((HighsBasis *)CONCAT44(in_stack_fffffffffffffef4,iVar2));
  return HVar3;
}

Assistant:

HighsStatus Highs::basisForSolution() {
  HighsLp& lp = model_.lp_;
  assert(!lp.isMip() || options_.solve_relaxation);
  assert(solution_.value_valid);
  invalidateBasis();
  HighsInt num_basic = 0;
  HighsBasis basis;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (std::fabs(lp.col_lower_[iCol] - solution_.col_value[iCol]) <=
        options_.primal_feasibility_tolerance) {
      basis.col_status.push_back(HighsBasisStatus::kLower);
    } else if (std::fabs(lp.col_upper_[iCol] - solution_.col_value[iCol]) <=
               options_.primal_feasibility_tolerance) {
      basis.col_status.push_back(HighsBasisStatus::kUpper);
    } else {
      num_basic++;
      basis.col_status.push_back(HighsBasisStatus::kBasic);
    }
  }
  const HighsInt num_basic_col = num_basic;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (std::fabs(lp.row_lower_[iRow] - solution_.row_value[iRow]) <=
        options_.primal_feasibility_tolerance) {
      basis.row_status.push_back(HighsBasisStatus::kLower);
    } else if (std::fabs(lp.row_upper_[iRow] - solution_.row_value[iRow]) <=
               options_.primal_feasibility_tolerance) {
      basis.row_status.push_back(HighsBasisStatus::kUpper);
    } else {
      num_basic++;
      basis.row_status.push_back(HighsBasisStatus::kBasic);
    }
  }
  const HighsInt num_basic_row = num_basic - num_basic_col;
  assert((int)basis.col_status.size() == lp.num_col_);
  assert((int)basis.row_status.size() == lp.num_row_);
  highsLogDev(options_.log_options, HighsLogType::kInfo,
              "LP has %d rows and solution yields %d possible basic variables "
              "(%d / %d; %d / %d)\n",
              (int)lp.num_row_, (int)num_basic, (int)num_basic_col,
              (int)lp.num_col_, (int)num_basic_row, (int)lp.num_row_);
  return this->setBasis(basis);
}